

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

void __thiscall CFFFileInput::FreeData(CFFFileInput *this)

{
  StringList *this_00;
  FontDictInfo *pFVar1;
  FontDictInfo **ppFVar2;
  CharStringsIndex pCVar3;
  void *pvVar4;
  PrivateDictInfo *pPVar5;
  pointer ppCVar6;
  pointer ppEVar7;
  ushort uVar8;
  TopDictInfo *pTVar9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  char **ppcVar12;
  CharStrings *pCVar13;
  _Base_ptr p_Var14;
  CharSetInfo *pCVar15;
  ulong uVar16;
  EncodingsInfo *pEVar17;
  UShortToDictOperandListMap *this_01;
  pointer ppCVar18;
  pointer ppEVar19;
  
  this_00 = &this->mName;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  (this->mName).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mName).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mName).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::clear(&(this->mNameToIndex)._M_t);
  pTVar9 = this->mTopDictIndex;
  if (pTVar9 != (TopDictInfo *)0x0) {
    if (this->mFontsCount == 0) {
LAB_0019a372:
      ppFVar2 = pTVar9[-1].mFDSelect;
      if (ppFVar2 != (FontDictInfo **)0x0) {
        lVar11 = (long)ppFVar2 * 0x50;
        do {
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                       *)(&pTVar9[-1].mTopDict._M_t._M_impl.field_0x0 + lVar11));
          lVar11 = lVar11 + -0x50;
        } while (lVar11 != 0);
      }
      operator_delete__(&pTVar9[-1].mFDSelect,(long)ppFVar2 * 0x50 + 8);
    }
    else {
      uVar16 = 0;
      do {
        pTVar9 = this->mTopDictIndex;
        pFVar1 = pTVar9[uVar16].mFDArray;
        if (pFVar1 != (FontDictInfo *)0x0) {
          pCVar13 = pFVar1[-1].mPrivateDict.mLocalSubrs;
          if (pCVar13 != (CharStrings *)0x0) {
            this_01 = &pFVar1[(long)((long)&pCVar13[-1].mCharStringsIndex + 7)].mFontDict;
            lVar11 = (long)pCVar13 * -0x88;
            do {
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
              ::~_Rb_tree(&(((PrivateDictInfo *)(this_01 + 1))->mPrivateDict)._M_t);
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
              ::~_Rb_tree(&this_01->_M_t);
              this_01 = (UShortToDictOperandListMap *)((long)(this_01 + -3) + 8);
              lVar11 = lVar11 + 0x88;
            } while (lVar11 != 0);
          }
          operator_delete__(&pFVar1[-1].mPrivateDict.mLocalSubrs,(long)pCVar13 * 0x88 + 8);
          pTVar9 = this->mTopDictIndex;
        }
        if (pTVar9[uVar16].mFDSelect != (FontDictInfo **)0x0) {
          operator_delete__(pTVar9[uVar16].mFDSelect);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < this->mFontsCount);
      pTVar9 = this->mTopDictIndex;
      if (pTVar9 != (TopDictInfo *)0x0) goto LAB_0019a372;
    }
    this->mTopDictIndex = (TopDictInfo *)0x0;
  }
  ppcVar12 = this->mStrings;
  if (ppcVar12 == (char **)0x0) goto LAB_0019a405;
  uVar8 = this->mStringsCount;
  if (uVar8 == 0) {
LAB_0019a3f8:
    operator_delete__(ppcVar12);
  }
  else {
    uVar16 = 0;
    do {
      if (this->mStrings[uVar16] != (char *)0x0) {
        operator_delete__(this->mStrings[uVar16]);
        uVar8 = this->mStringsCount;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar8);
    ppcVar12 = this->mStrings;
    if (ppcVar12 != (char **)0x0) goto LAB_0019a3f8;
  }
  this->mStrings = (char **)0x0;
LAB_0019a405:
  std::
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_unsigned_short>,_std::_Select1st<std::pair<const_char_*const,_unsigned_short>_>,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::clear(&(this->mStringToSID)._M_t);
  pCVar3 = (this->mGlobalSubrs).mCharStringsIndex;
  if (pCVar3 != (CharStringsIndex)0x0) {
    operator_delete__(pCVar3);
  }
  (this->mGlobalSubrs).mCharStringsIndex = (CharStringsIndex)0x0;
  pCVar13 = this->mCharStrings;
  if (pCVar13 != (CharStrings *)0x0) {
    uVar8 = this->mFontsCount;
    if (uVar8 != 0) {
      lVar11 = 8;
      uVar16 = 0;
      do {
        pvVar4 = *(void **)(&this->mCharStrings->mCharStringsType + lVar11);
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
          uVar8 = this->mFontsCount;
        }
        uVar16 = uVar16 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar16 < uVar8);
      pCVar13 = this->mCharStrings;
    }
    operator_delete(pCVar13,0x10);
    this->mCharStrings = (CharStrings *)0x0;
  }
  pPVar5 = this->mPrivateDicts;
  if (pPVar5 != (PrivateDictInfo *)0x0) {
    pCVar13 = pPVar5[-1].mLocalSubrs;
    if (pCVar13 != (CharStrings *)0x0) {
      lVar11 = (long)pCVar13 * 0x48;
      do {
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                     *)((long)pPVar5 + lVar11 + -0x38));
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != 0);
    }
    operator_delete__(&pPVar5[-1].mLocalSubrs,(long)pCVar13 * 0x48 + 8);
  }
  this->mPrivateDicts = (PrivateDictInfo *)0x0;
  for (p_Var10 = (this->mLocalSubrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &(this->mLocalSubrs)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    p_Var14 = p_Var10[1]._M_parent;
    if (p_Var14->_M_parent != (_Base_ptr)0x0) {
      operator_delete__(p_Var14->_M_parent);
      p_Var14 = p_Var10[1]._M_parent;
    }
    operator_delete(p_Var14,0x10);
  }
  ppCVar18 = (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar18 !=
      (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pCVar15 = *ppCVar18;
      if (pCVar15->mSIDs != (unsigned_short *)0x0) {
        operator_delete__(pCVar15->mSIDs);
        pCVar15 = *ppCVar18;
      }
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_IndexElement_*>,_std::_Select1st<std::pair<const_unsigned_short,_IndexElement_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
      ::clear(&(pCVar15->mSIDToGlyphMap)._M_t);
      pCVar15 = *ppCVar18;
      if (pCVar15 != (CharSetInfo *)0x0) {
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_IndexElement_*>,_std::_Select1st<std::pair<const_unsigned_short,_IndexElement_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
        ::~_Rb_tree(&(pCVar15->mSIDToGlyphMap)._M_t);
      }
      operator_delete(pCVar15,0x40);
      ppCVar18 = ppCVar18 + 1;
    } while (ppCVar18 !=
             (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    ppCVar6 = (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar18 != ppCVar6) {
      (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar6;
    }
  }
  ppEVar19 = (this->mEncodings).
             super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppEVar19 !=
      (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pEVar17 = *ppEVar19;
      if (pEVar17->mEncoding == (Byte *)0x0) {
LAB_0019a5ab:
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~_Rb_tree(&(pEVar17->mSupplements)._M_t);
      }
      else {
        operator_delete__(pEVar17->mEncoding);
        pEVar17 = *ppEVar19;
        if (pEVar17 != (EncodingsInfo *)0x0) goto LAB_0019a5ab;
        pEVar17 = (EncodingsInfo *)0x0;
      }
      operator_delete(pEVar17,0x50);
      ppEVar19 = ppEVar19 + 1;
    } while (ppEVar19 !=
             (this->mEncodings).
             super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppEVar7 = (this->mEncodings).
              super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar19 != ppEVar7) {
      (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppEVar7;
    }
  }
  return;
}

Assistant:

void CFFFileInput::FreeData()
{
	mName.clear();
	mNameToIndex.clear();
	if(mTopDictIndex != NULL)
	{
		for(unsigned long i=0; i < mFontsCount;++i)
		{
			delete[] mTopDictIndex[i].mFDArray;
			delete[] mTopDictIndex[i].mFDSelect;
		}
		delete[] mTopDictIndex;
		mTopDictIndex = NULL;
	}
	if(mStrings != NULL)
	{
		for(unsigned long i =0 ; i <mStringsCount; ++ i)
			delete[] mStrings[i];
		delete[] mStrings;
		mStrings = NULL;
	}
	mStringToSID.clear();
	delete[] mGlobalSubrs.mCharStringsIndex;
	mGlobalSubrs.mCharStringsIndex = NULL;
	if(mCharStrings != NULL)
	{
		for(unsigned long i=0; i < mFontsCount; ++i)
			delete[] mCharStrings[i].mCharStringsIndex;
		delete mCharStrings;
		mCharStrings = NULL;
	}
	delete[] mPrivateDicts;
	mPrivateDicts = NULL;

	LongFilePositionTypeToCharStringsMap::iterator itLocalSubrs = mLocalSubrs.begin();
	for(; itLocalSubrs != mLocalSubrs.end(); ++itLocalSubrs)
	{
		delete[] itLocalSubrs->second->mCharStringsIndex;
		delete itLocalSubrs->second;
	}

	CharSetInfoVector::iterator itCharSets = mCharSets.begin();
	for(; itCharSets != mCharSets.end(); ++itCharSets)
	{
		delete[] (*itCharSets)->mSIDs;
		(*itCharSets)->mSIDToGlyphMap.clear();
		delete (*itCharSets);
	}
	mCharSets.clear();

	EncodingsInfoVector::iterator itEncodings = mEncodings.begin();
	for(; itEncodings != mEncodings.end(); ++itEncodings)
	{
		delete[] (*itEncodings)->mEncoding;
		delete (*itEncodings);
	}
	mEncodings.clear();
}